

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::writeFileLPBase
          (SPxLPBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  size_t sVar1;
  long lVar2;
  ofstream tmp;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,filename,_S_out);
  sVar1 = strlen(filename);
  if ((((sVar1 < 5) || (filename[sVar1 - 1] != 's')) || (filename[sVar1 - 2] != 'p')) ||
     ((filename[sVar1 - 3] != 'm' || (lVar2 = 0x108, filename[sVar1 - 4] != '.')))) {
    lVar2 = 0x100;
  }
  (**(code **)((long)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                     super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar2))
            (this,&local_230,rowNames,colNames,p_intvars,writeZeroObjective);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

virtual void writeFileLPBase(const char* filename, const NameSet* rowNames = nullptr,
                                const NameSet* colNames = nullptr, const DIdxSet* p_intvars = nullptr,
                                const bool writeZeroObjective = false) const
   {

      std::ofstream tmp(filename);
      size_t len_f = strlen(filename);

      if(len_f > 4 && filename[len_f - 1] == 's' && filename[len_f - 2] == 'p'
            && filename[len_f - 3] == 'm' && filename[len_f - 4] == '.')
      {
         writeMPS(tmp, rowNames, colNames, p_intvars, writeZeroObjective);
      }
      else
      {
         writeLPF(tmp, rowNames, colNames, p_intvars, writeZeroObjective);
      }
   }